

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O2

UINT8 device_start_k051649(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  UINT32 UVar2;
  DEV_DATA chip;
  UINT8 UVar3;
  
  chip.chipInf = calloc(1,0xf0);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar3 = 0xff;
  }
  else {
    *(UINT8 *)((long)chip.chipInf + 0xee) = cfg->flags;
    uVar1 = cfg->clock;
    *(uint *)((long)chip.chipInf + 0xe4) = uVar1;
    *(uint *)&((DEV_DATA *)((long)chip.chipInf + 0xe8))->chipInf = uVar1 >> 4;
    UVar3 = '\0';
    k051649_set_mute_mask(chip.chipInf,0);
    *(void **)chip.chipInf = chip.chipInf;
    UVar2 = *(UINT32 *)((long)chip.chipInf + 0xe8);
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = UVar2;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_k051649(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	k051649_state *info;

	info = (k051649_state *)calloc(1, sizeof(k051649_state));
	if (info == NULL)
		return 0xFF;

	// get stream channels
	info->mode_plus = cfg->flags;
	info->mclock = cfg->clock;
	info->rate = info->mclock / 16;

	k051649_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);
	return 0x00;
}